

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O2

void __thiscall DLightTransfer::Serialize(DLightTransfer *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar1 = FSerializer::operator()(arc,"lastlight",&this->LastLight);
  pFVar1 = FSerializer::operator()(pFVar1,"source",&this->Source);
  pFVar1 = FSerializer::operator()(pFVar1,"targettag",&this->TargetTag);
  FSerializer::operator()(pFVar1,"copyfloor",&this->CopyFloor);
  return;
}

Assistant:

void DLightTransfer::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("lastlight", LastLight)
		("source", Source)
		("targettag", TargetTag)
		("copyfloor", CopyFloor);
}